

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# ImfTiledOutputFile.cpp
# Opt level: O0

void __thiscall Imf_3_3::anon_unknown_5::TileBuffer::TileBuffer(TileBuffer *this,Compressor *comp)

{
  long in_RSI;
  Array<char> *in_RDI;
  uint in_stack_0000000c;
  Semaphore *in_stack_00000010;
  
  Array<char>::Array(in_RDI);
  in_RDI[1]._size = 0;
  *(undefined4 *)&in_RDI[1]._data = 0;
  in_RDI[2]._size = in_RSI;
  TileCoord::TileCoord((TileCoord *)&in_RDI[2]._data,0,0,0,0);
  *(undefined1 *)&in_RDI[3]._data = 0;
  std::__cxx11::string::string((string *)(in_RDI + 4));
  IlmThread_3_3::Semaphore::Semaphore(in_stack_00000010,in_stack_0000000c);
  return;
}

Assistant:

TileBuffer::TileBuffer (Compressor* comp)
    : dataPtr (0)
    , dataSize (0)
    , compressor (comp)
    , hasException (false)
    , exception ()
    , _sem (1)
{
    // empty
}